

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunks
          (BamStandardIndex *this,BaiAlignmentChunkVector *chunks)

{
  IBamIODevice *pIVar1;
  pointer pBVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  pointer chunk;
  allocator local_66;
  allocator local_65;
  int32_t chunkCount;
  string local_60;
  string local_40;
  
  MergeAlignmentChunks(this,chunks);
  chunkCount = (int32_t)((ulong)((long)(chunks->
                                       super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(chunks->
                                      super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&chunkCount);
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&chunkCount,4);
  if (CONCAT44(extraout_var,iVar3) == 4) {
    pBVar2 = (chunks->
             super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (chunk = (chunks->
                 super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                 )._M_impl.super__Vector_impl_data._M_start; chunk != pBVar2; chunk = chunk + 1) {
      WriteAlignmentChunk(this,chunk);
    }
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"BamStandardIndex::WriteAlignmentChunks",&local_65);
  std::__cxx11::string::string((string *)&local_60,"could not write BAI chunk count",&local_66);
  BamException::BamException(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteAlignmentChunks(BaiAlignmentChunkVector& chunks)
{

    // make sure chunks are merged (simplified) before writing & saving summary
    MergeAlignmentChunks(chunks);

    // write chunks
    int32_t chunkCount = chunks.size();
    if (m_isBigEndian) SwapEndian_32(chunkCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&chunkCount, sizeof(chunkCount));
    if (numBytesWritten != sizeof(chunkCount))
        throw BamException("BamStandardIndex::WriteAlignmentChunks",
                           "could not write BAI chunk count");

    // iterate over chunks
    BaiAlignmentChunkVector::const_iterator chunkIter = chunks.begin();
    BaiAlignmentChunkVector::const_iterator chunkEnd = chunks.end();
    for (; chunkIter != chunkEnd; ++chunkIter)
        WriteAlignmentChunk((*chunkIter));
}